

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::DynamicMapField::AllocateMapValue
          (DynamicMapField *this,MapValueRef *map_val)

{
  once_flag *__once;
  int iVar1;
  CppType CVar2;
  undefined4 extraout_var;
  FieldDescriptor *field;
  Message *pMVar3;
  undefined4 extraout_var_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  Reflection *this_00;
  FieldDescriptor *local_38;
  _func_void_FieldDescriptor_ptr *local_30;
  
  iVar1 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x11])();
  field = Descriptor::map_value((Descriptor *)CONCAT44(extraout_var,iVar1));
  if (*(once_flag **)(field + 0x18) == (once_flag *)0x0) {
    CVar2 = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4);
    (map_val->super_MapValueConstRef).type_ = CVar2;
  }
  else {
    local_30 = FieldDescriptor::TypeOnceInit;
    local_38 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),&local_30,&local_38);
    __once = *(once_flag **)(field + 0x18);
    CVar2 = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4);
    (map_val->super_MapValueConstRef).type_ = CVar2;
    if (__once != (once_flag *)0x0) {
      local_30 = FieldDescriptor::TypeOnceInit;
      local_38 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (__once,&local_30,&local_38);
      CVar2 = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4);
    }
  }
  switch(CVar2) {
  case CPPTYPE_INT32:
  case CPPTYPE_ENUM:
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Arena::Create<int>((this->
                                super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                ).super_MapFieldBase.arena_);
    break;
  case CPPTYPE_INT64:
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Arena::Create<long>((this->
                                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                 ).super_MapFieldBase.arena_);
    break;
  case CPPTYPE_UINT32:
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Arena::Create<unsigned_int>
                       ((this->
                        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                        ).super_MapFieldBase.arena_);
    break;
  case CPPTYPE_UINT64:
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Arena::Create<unsigned_long>
                       ((this->
                        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                        ).super_MapFieldBase.arena_);
    break;
  case CPPTYPE_DOUBLE:
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Arena::Create<double>
                       ((this->
                        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                        ).super_MapFieldBase.arena_);
    break;
  case CPPTYPE_FLOAT:
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Arena::Create<float>
                       ((this->
                        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                        ).super_MapFieldBase.arena_);
    break;
  case CPPTYPE_BOOL:
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Arena::Create<bool>((this->
                                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                 ).super_MapFieldBase.arena_);
    break;
  case CPPTYPE_STRING:
    pbVar4 = Arena::Create<std::__cxx11::string>
                       ((this->
                        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                        ).super_MapFieldBase.arena_);
    break;
  case CPPTYPE_MESSAGE:
    (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x11])();
    pMVar3 = Reflection::GetMessage(this_00,this->default_entry_,field,(MessageFactory *)0x0);
    iVar1 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[3])
                      (pMVar3,(this->
                              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                              ).super_MapFieldBase.arena_);
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(extraout_var_00,iVar1);
    break;
  default:
    goto switchD_003a31ad_default;
  }
  (map_val->super_MapValueConstRef).data_ = pbVar4;
switchD_003a31ad_default:
  return;
}

Assistant:

void DynamicMapField::AllocateMapValue(MapValueRef* map_val) {
  const FieldDescriptor* val_des = default_entry_->GetDescriptor()->map_value();
  map_val->SetType(val_des->cpp_type());
  // Allocate memory for the MapValueRef, and initialize to
  // default value.
  switch (val_des->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)                           \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: {                 \
    TYPE* value = Arena::Create<TYPE>(MapFieldBase::arena_); \
    map_val->SetValue(value);                                \
    break;                                                   \
  }
    HANDLE_TYPE(INT32, int32_t);
    HANDLE_TYPE(INT64, int64_t);
    HANDLE_TYPE(UINT32, uint32_t);
    HANDLE_TYPE(UINT64, uint64_t);
    HANDLE_TYPE(DOUBLE, double);
    HANDLE_TYPE(FLOAT, float);
    HANDLE_TYPE(BOOL, bool);
    HANDLE_TYPE(STRING, std::string);
    HANDLE_TYPE(ENUM, int32_t);
#undef HANDLE_TYPE
    case FieldDescriptor::CPPTYPE_MESSAGE: {
      const Message& message =
          default_entry_->GetReflection()->GetMessage(*default_entry_, val_des);
      Message* value = message.New(MapFieldBase::arena_);
      map_val->SetValue(value);
      break;
    }
  }
}